

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu.cpp
# Opt level: O2

int ncnn::cpu_support_arm_bf16(void)

{
  return 0;
}

Assistant:

int cpu_support_arm_bf16()
{
#if defined __ANDROID__ || defined __linux__
#if __aarch64__
    return g_hwcaps2 & HWCAP2_BF16;
#else
    return 0;
#endif
#elif __APPLE__
#if __aarch64__
    return 0; // no known apple cpu support armv8.6 bf16
#else
    return 0;
#endif
#else
    return 0;
#endif
}